

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::TracingServiceImpl::TracingSession::TracingSession
          (TracingSession *this,TracingSessionID session_id,ConsumerEndpointImpl *consumer,
          TraceConfig *new_config,TaskRunner *task_runner)

{
  int local_44 [5];
  TaskRunner *local_30;
  TaskRunner *task_runner_local;
  TraceConfig *new_config_local;
  ConsumerEndpointImpl *consumer_local;
  TracingSessionID session_id_local;
  TracingSession *this_local;
  
  this->id = session_id;
  this->consumer_maybe_null = consumer;
  this->consumer_uid = consumer->uid_;
  local_30 = task_runner;
  task_runner_local = (TaskRunner *)new_config;
  new_config_local = (TraceConfig *)consumer;
  consumer_local = (ConsumerEndpointImpl *)session_id;
  session_id_local = (TracingSessionID)this;
  std::
  vector<perfetto::TracingServiceImpl::TracingSession::TriggerInfo,_std::allocator<perfetto::TracingServiceImpl::TracingSession::TriggerInfo>_>
  ::vector(&this->received_triggers);
  protos::gen::TraceConfig::TraceConfig(&this->config,(TraceConfig *)task_runner_local);
  std::
  multimap<unsigned_short,_perfetto::TracingServiceImpl::DataSourceInstance,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_perfetto::TracingServiceImpl::DataSourceInstance>_>_>
  ::multimap(&this->data_source_instances);
  std::
  map<unsigned_long,_perfetto::TracingServiceImpl::PendingFlush,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_perfetto::TracingServiceImpl::PendingFlush>_>_>
  ::map(&this->pending_flushes);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&this->buffers_index);
  std::
  map<std::pair<unsigned_short,_unsigned_short>,_unsigned_int,_std::less<std::pair<unsigned_short,_unsigned_short>_>,_std::allocator<std::pair<const_std::pair<unsigned_short,_unsigned_short>,_unsigned_int>_>_>
  ::map(&this->packet_sequence_ids);
  this->last_packet_sequence_id = 1;
  this->should_emit_stats = false;
  this->should_emit_sync_marker = false;
  this->did_emit_config = false;
  this->did_emit_system_info = false;
  this->num_triggers_emitted_into_trace = 0;
  this->invalid_packets = 0;
  this->flushes_requested = 0;
  this->flushes_succeeded = 0;
  this->flushes_failed = 0;
  this->final_flush_outcome = TraceStats_FinalFlushOutcome_FINAL_FLUSH_UNSPECIFIED;
  this->did_notify_all_data_source_started = false;
  std::
  vector<perfetto::TracingServiceImpl::TracingSession::LifecycleEvent,_std::allocator<perfetto::TracingServiceImpl::TracingSession::LifecycleEvent>_>
  ::vector(&this->lifecycle_events);
  std::
  vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
  ::vector(&this->initial_clock_snapshot);
  perfetto::base::
  CircularQueue<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>
  ::CircularQueue(&this->clock_snapshot_ring_buffer,0x400);
  this->state = DISABLED;
  ::std::__cxx11::string::string((string *)&this->detach_key);
  perfetto::base::
  ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
  ::ScopedResource(&this->write_into_file,-1);
  this->write_period_ms = 0;
  this->max_file_size_bytes = 0;
  this->bytes_written_into_file = 0;
  ::std::function<void_()>::function((function<void_()> *)&this->on_disable_callback_for_bugreport);
  this->seized_for_bugreport = false;
  perfetto::base::PeriodicTask::PeriodicTask(&this->snapshot_periodic_task,local_30);
  ::std::unique_ptr<protozero::MessageFilter,std::default_delete<protozero::MessageFilter>>::
  unique_ptr<std::default_delete<protozero::MessageFilter>,void>
            ((unique_ptr<protozero::MessageFilter,std::default_delete<protozero::MessageFilter>> *)
             &this->trace_filter);
  this->filter_input_packets = 0;
  this->filter_input_bytes = 0;
  this->filter_output_bytes = 0;
  this->filter_errors = 0;
  local_44[1] = 3;
  local_44[0] = 0x40;
  ::std::
  vector<perfetto::TracingServiceImpl::TracingSession::LifecycleEvent,std::allocator<perfetto::TracingServiceImpl::TracingSession::LifecycleEvent>>
  ::emplace_back<perfetto::protos::pbzero::TracingServiceEvent::_unnamed_type_1_,int>
            ((vector<perfetto::TracingServiceImpl::TracingSession::LifecycleEvent,std::allocator<perfetto::TracingServiceImpl::TracingSession::LifecycleEvent>>
              *)&this->lifecycle_events,(anon_enum_32 *)(local_44 + 1),local_44);
  return;
}

Assistant:

TracingServiceImpl::TracingSession::TracingSession(
    TracingSessionID session_id,
    ConsumerEndpointImpl* consumer,
    const TraceConfig& new_config,
    base::TaskRunner* task_runner)
    : id(session_id),
      consumer_maybe_null(consumer),
      consumer_uid(consumer->uid_),
      config(new_config),
      snapshot_periodic_task(task_runner) {
  // all_data_sources_flushed is special because we store up to 64 events of
  // this type. Other events will go through the default case in
  // SnapshotLifecycleEvent() where they will be given a max history of 1.
  lifecycle_events.emplace_back(
      protos::pbzero::TracingServiceEvent::kAllDataSourcesFlushedFieldNumber,
      64 /* max_size */);
}